

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.cpp
# Opt level: O1

string * __thiscall
jaegertracing::Span::serviceNameNoLock_abi_cxx11_(string *__return_storage_ptr__,Span *this)

{
  element_type *peVar1;
  pointer pcVar2;
  
  peVar1 = (this->_tracer).
           super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (peVar1->_serviceName)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,
               pcVar2 + (peVar1->_serviceName)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Span::serviceNameNoLock() const noexcept
{
    if (!_tracer) {
        return std::string();
    }
    return _tracer->serviceName();
}